

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_gstream.c
# Opt level: O1

void HTS_GStreamSet_clear(HTS_GStreamSet *gss)

{
  ulong uVar1;
  ulong uVar2;
  
  if (gss->gstream != (HTS_GStream *)0x0) {
    if (gss->nstream != 0) {
      uVar2 = 0;
      do {
        if (gss->gstream[uVar2].par != (double **)0x0) {
          if (gss->total_frame != 0) {
            uVar1 = 0;
            do {
              HTS_free(gss->gstream[uVar2].par[uVar1]);
              uVar1 = uVar1 + 1;
            } while (uVar1 < gss->total_frame);
          }
          HTS_free(gss->gstream[uVar2].par);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < gss->nstream);
    }
    HTS_free(gss->gstream);
  }
  if (gss->gspeech != (double *)0x0) {
    HTS_free(gss->gspeech);
  }
  gss->nstream = 0;
  gss->gstream = (HTS_GStream *)0x0;
  gss->total_nsample = 0;
  gss->total_frame = 0;
  gss->gspeech = (double *)0x0;
  return;
}

Assistant:

void HTS_GStreamSet_clear(HTS_GStreamSet * gss)
{
   size_t i, j;

   if (gss->gstream) {
      for (i = 0; i < gss->nstream; i++) {
         if (gss->gstream[i].par != NULL) {
            for (j = 0; j < gss->total_frame; j++)
               HTS_free(gss->gstream[i].par[j]);
            HTS_free(gss->gstream[i].par);
         }
      }
      HTS_free(gss->gstream);
   }
   if (gss->gspeech)
      HTS_free(gss->gspeech);
   HTS_GStreamSet_initialize(gss);
}